

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  byte bVar1;
  TValue *pTVar2;
  int iVar3;
  GCstr *pGVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(L->glref).ptr32;
  if (*(int *)(uVar5 + 400) == 0) {
    bVar1 = *(byte *)(uVar5 + 0x109);
    *(byte *)(uVar5 + 0x31c) = *(byte *)(uVar5 + 0x31c) & 0xef;
    iVar3 = lj_vm_cpcall(L,func,ud,cpcall);
    if (iVar3 != 0) {
      *(byte *)(uVar5 + 0x109) = *(byte *)(uVar5 + 0x109) & 0xf | bVar1 & 0xf0;
    }
    return iVar3;
  }
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  pGVar4 = lj_err_str(L,LJ_ERR_JITCALL);
  (pTVar2->u32).lo = (uint32_t)pGVar4;
  (pTVar2->field_2).it = 0xfffffffb;
  if (*(code **)(uVar5 + 0x178) != (code *)0x0) {
    (**(code **)(uVar5 + 0x178))(L);
  }
  exit(1);
}

Assistant:

LUA_API int lua_cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  /* Forbid Lua world re-entrancy while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITCALL));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Never record across Lua VM entrance */
  status = lj_vm_cpcall(L, func, ud, cpcall);
  if (status) hook_restore(g, oldh);
  return status;
}